

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O0

int __thiscall MemFile::open(MemFile *this,char *__file,int __oflag,...)

{
  allocator<unsigned_char> *this_00;
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  posix_error *ppVar4;
  int *piVar5;
  uint8_t *puVar6;
  size_t sVar7;
  unzFile file;
  exception *peVar8;
  long lVar9;
  size_type sVar10;
  undefined8 uVar11;
  bool bVar12;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  lzma_ret local_be0 [2];
  lzma_ret ret;
  uint32_t flags;
  lzma_stream strm;
  MEMORY mem2_1;
  gz_header header_1;
  Bytef name_1 [512];
  int local_8dc;
  undefined1 auStack_8d8 [4];
  int zerr_1;
  z_stream stream_1;
  MEMORY mem2;
  FILE *f_1;
  gz_header header;
  Bytef name [512];
  uchar *puStack_5e8;
  int zerr;
  z_stream stream;
  undefined1 local_570 [12];
  undefined1 local_560 [12];
  undefined1 local_550 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zbuf;
  ifstream zs;
  gzFile gf;
  char szFile [512];
  ulong local_120;
  uLong ulMaxSize;
  unz_file_info sInfo;
  int nRet;
  unzFile hfZip;
  FILE *f;
  int iStack_70;
  bool have_zlib;
  size_t uRead;
  undefined1 local_58 [8];
  MEMORY mem;
  string filename;
  bool uncompress_local;
  string *path__local;
  MemFile *this_local;
  
  std::__cxx11::string::string((string *)&mem.pb);
  MEMORY::MEMORY((MEMORY *)local_58,0x10000001);
  _iStack_70 = 0;
  pcVar2 = (char *)zlibVersion();
  bVar12 = *pcVar2 == '1';
  if (((__oflag & 1U) != 0) && (bVar12)) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen64(pcVar2,"rb");
    if (pFVar3 == (FILE *)0x0) {
      ppVar4 = (posix_error *)__cxa_allocate_exception(0x20);
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      posix_error::posix_error(ppVar4,iVar1,pcVar2);
      __cxa_throw(ppVar4,&posix_error::typeinfo,posix_error::~posix_error);
    }
    puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
    sVar7 = fread(puVar6,1,2,pFVar3);
    if (sVar7 == 0) {
      puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
      puVar6[1] = '\0';
      puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
      *puVar6 = '\0';
    }
    fclose(pFVar3);
  }
  if (((__oflag & 1U) != 0) && (bVar12)) {
    puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
    if ((*puVar6 == 'P') &&
       (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), puVar6[1] == 'K')) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      file = unzOpen(pcVar2);
      if (file == (unzFile)0x0) {
        peVar8 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[13]>(peVar8,(char (*) [13])"bad zip file");
        __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
      }
      local_120 = 0;
      sInfo.tmu_date.tm_year = unzGoToFirstFile(file);
      while (sInfo.tmu_date.tm_year == 0) {
        unzGetCurrentFileInfo
                  (file,(unz_file_info *)&ulMaxSize,(char *)&gf,0x200,(void *)0x0,0,(char *)0x0,0);
        if (sInfo.compressed_size != 0) {
          iVar1 = GetFileType((char *)&gf);
          if ((iVar1 != 0) && (iVar1 = unzOpenCurrentFile(file), iVar1 == 0)) {
            puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
            sInfo.tmu_date.tm_year = unzReadCurrentFile(file,puVar6,(uint)mem._vptr_MEMORY);
            unzCloseCurrentFile(file);
            std::__cxx11::string::operator=((string *)&mem.pb,(char *)&gf);
            break;
          }
          if (local_120 < sInfo.compressed_size) {
            local_120 = sInfo.compressed_size;
          }
        }
        sInfo.tmu_date.tm_year = unzGoToNextFile(file);
      }
      if (sInfo.tmu_date.tm_year == 0xffffff9c) {
        sInfo.tmu_date.tm_year = unzGoToFirstFile(file);
        while (sInfo.tmu_date.tm_year == 0) {
          unzGetCurrentFileInfo
                    (file,(unz_file_info *)&ulMaxSize,(char *)0x0,0,(void *)0x0,0,(char *)0x0,0);
          if ((sInfo.compressed_size == local_120) && (iVar1 = unzOpenCurrentFile(file), iVar1 == 0)
             ) {
            puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
            sInfo.tmu_date.tm_year = unzReadCurrentFile(file,puVar6,(uint)mem._vptr_MEMORY);
            unzCloseCurrentFile(file);
            break;
          }
          sInfo.tmu_date.tm_year = unzGoToNextFile(file);
        }
      }
      unzClose(file);
      if ((int)sInfo.tmu_date.tm_year < 0) {
        peVar8 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[24],int&,char_const(&)[2]>
                  (peVar8,(char (*) [24])"zip extraction failed (",(int *)&sInfo.tmu_date.tm_year,
                   (char (*) [2])0x2a8e34);
        __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
      }
      _iStack_70 = (size_t)(int)sInfo.tmu_date.tm_year;
      this->m_compress = Zip;
    }
    else {
      puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
      if ((*puVar6 == '\x1f') &&
         (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), puVar6[1] == 0x8b))
      {
        uVar11 = std::__cxx11::string::c_str();
        lVar9 = gzopen64(uVar11,"rb");
        if (lVar9 == 0) {
          ppVar4 = (posix_error *)__cxa_allocate_exception(0x20);
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          posix_error::posix_error(ppVar4,iVar1,pcVar2);
          __cxa_throw(ppVar4,&posix_error::typeinfo,posix_error::~posix_error);
        }
        puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
        iVar1 = gzread(lVar9,puVar6,(uint)mem._vptr_MEMORY);
        _iStack_70 = (size_t)iVar1;
        iVar1 = gzdirect(lVar9);
        this->m_compress = (uint)(iVar1 == 0) * 2;
        gzclose(lVar9);
        if (this->m_compress == Gzip) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream
                    (&zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,pcVar2,_S_bin);
          std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                    ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_560,
                     (istream_type *)
                     &zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
          std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                    ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_570);
          this_00 = (allocator<unsigned_char> *)((long)&stream.reserved + 7);
          std::allocator<unsigned_char>::allocator(this_00);
          __last._12_4_ = 0;
          __last._M_sbuf = (streambuf_type *)local_570._0_8_;
          __last._M_c = local_570._8_4_;
          __first._12_4_ = 0;
          __first._M_sbuf = (streambuf_type *)local_560._0_8_;
          __first._M_c = local_560._8_4_;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_550,__first,__last
                     ,this_00);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)((long)&stream.reserved + 7));
          stream.data_type = 0;
          stream._92_4_ = 0;
          stream.adler = 0;
          stream.zfree = (free_func)0x0;
          stream.opaque = (voidpf)0x0;
          stream.state = (internal_state *)0x0;
          stream.zalloc = (alloc_func)0x0;
          stream.total_out = 0;
          stream.msg = (char *)0x0;
          stream.next_out = (Bytef *)0x0;
          stream.avail_out = 0;
          stream._36_4_ = 0;
          stream.avail_in = 0;
          stream._12_4_ = 0;
          stream.total_in = 0;
          puStack_5e8 = (uchar *)0x0;
          stream.next_in = (Bytef *)0x0;
          puStack_5e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_550);
          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_550);
          stream.next_in = (Bytef *)CONCAT44(stream.next_in._4_4_,(int)sVar10);
          stream.total_in =
               (uLong)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_550)
          ;
          stream.next_out = (Bytef *)((ulong)stream.next_out & 0xffffffff00000000);
          iVar1 = inflateInit2_(&stack0xfffffffffffffa18,0x1f,"1.2.11",0x70);
          if (iVar1 == 0) {
            memset(&header.done,0,0x200);
            header.comment = (Bytef *)0x0;
            header.comm_max = 0;
            header.hcrc = 0;
            header.name_max = 0;
            header._52_4_ = 0;
            header.extra = (Bytef *)0x0;
            header.time = 0;
            header.xflags = 0;
            header.os = 0;
            f_1 = (FILE *)0x0;
            header.text = 0;
            header._4_4_ = 0;
            header.name = (Bytef *)0x200;
            header._32_8_ = &header.done;
            inflateGetHeader(&stack0xfffffffffffffa18,&f_1);
            iVar1 = inflate(&stack0xfffffffffffffa18,0);
            if ((iVar1 == 0) && ((char)header.done != '\0')) {
              std::__cxx11::string::operator=((string *)&mem.pb,(char *)&header.done);
            }
            inflateEnd(&stack0xfffffffffffffa18);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_550);
          std::ifstream::~ifstream
                    (&zbuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
  }
  if (_iStack_70 == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen64(pcVar2,"rb");
    if (pFVar3 == (FILE *)0x0) {
      ppVar4 = (posix_error *)__cxa_allocate_exception(0x20);
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      posix_error::posix_error(ppVar4,iVar1,pcVar2);
      __cxa_throw(ppVar4,&posix_error::typeinfo,posix_error::~posix_error);
    }
    puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58);
    _iStack_70 = fread(puVar6,1,(long)(int)(uint)mem._vptr_MEMORY,pFVar3);
    fclose(pFVar3);
    this->m_compress = None;
  }
  if ((((__oflag & 1U) != 0) &&
      (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), *puVar6 == 'P')) &&
     (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), puVar6[1] == 'K')) {
    peVar8 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[47]>
              (peVar8,(char (*) [47])"zlib support is not available for zipped files");
    __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
  }
  if ((((__oflag & 1U) != 0) &&
      (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), *puVar6 == '\x1f')) &&
     (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), puVar6[1] == 0x8b)) {
    if (!bVar12) {
      peVar8 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[48]>
                (peVar8,(char (*) [48])"zlib support is not available for gzipped files");
      __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
    }
    MEMORY::MEMORY((MEMORY *)&stream_1.reserved,0x10000001);
    stream_1.data_type = 0;
    stream_1._92_4_ = 0;
    stream_1.adler = 0;
    stream_1.zfree = (free_func)0x0;
    stream_1.opaque = (voidpf)0x0;
    stream_1.state = (internal_state *)0x0;
    stream_1.zalloc = (alloc_func)0x0;
    stream_1.total_out = 0;
    stream_1.msg = (char *)0x0;
    stream_1.avail_out = 0;
    stream_1._36_4_ = 0;
    stream_1.avail_in = 0;
    stream_1._12_4_ = 0;
    auStack_8d8 = (undefined1  [4])mem.size;
    zerr_1 = mem._12_4_;
    stream_1.next_in = (Bytef *)(_iStack_70 & 0xffffffff);
    stream_1.next_out = (Bytef *)(ulong)(uint)mem2._vptr_MEMORY;
    local_8dc = inflateInit2_(auStack_8d8,0x1f,"1.2.11",0x70);
    if (local_8dc == 0) {
      memset(&header_1.done,0,0x200);
      header_1.comment = (Bytef *)0x0;
      header_1.comm_max = 0;
      header_1.hcrc = 0;
      header_1.name_max = 0;
      header_1._52_4_ = 0;
      header_1.extra = (Bytef *)0x0;
      header_1.time = 0;
      header_1.xflags = 0;
      header_1.os = 0;
      mem2_1.pb = (uint8_t *)0x0;
      header_1.text = 0;
      header_1._4_4_ = 0;
      header_1.name = (Bytef *)0x200;
      header_1._32_8_ = &header_1.done;
      local_8dc = inflateGetHeader(auStack_8d8,&mem2_1.pb);
      local_8dc = inflate(auStack_8d8,4);
      if ((local_8dc == 1) && ((char)header_1.done != '\0')) {
        std::__cxx11::string::operator=((string *)&mem.pb,(char *)&header_1.done);
      }
      inflateEnd(auStack_8d8);
    }
    if (local_8dc != 1) {
      peVar8 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],int&,char_const(&)[2]>
                (peVar8,(char (*) [28])"gzip decompression failed (",&local_8dc,
                 (char (*) [2])0x2a8e34);
      __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
    }
    _iStack_70 = stream_1._32_8_;
    memcpy((void *)mem._8_8_,(void *)mem2._8_8_,stream_1._32_8_);
    this->m_compress = Zip;
    MEMORY::~MEMORY((MEMORY *)&stream_1.reserved);
  }
  if ((((__oflag & 1U) != 0) &&
      (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), *puVar6 == 'B')) &&
     (puVar6 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_58), puVar6[1] == 'Z')) {
    peVar8 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[31]>
              (peVar8,(char (*) [31])"bzip2 support is not available");
    __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
  }
  if ((((__oflag & 1U) != 0) && (6 < (int)(uint)mem._vptr_MEMORY)) &&
     (iVar1 = memcmp((void *)mem._8_8_,anon_var_dwarf_174de1,6), iVar1 == 0)) {
    MEMORY::MEMORY((MEMORY *)&strm.reserved_enum1,0x10000001);
    memset(&ret,0,0x88);
    local_be0[1] = 2;
    local_be0[0] = lzma_stream_decoder(&ret,0xffffffffffffffff,2);
    if (local_be0[0] == LZMA_OK) {
      ret = mem.size;
      flags = mem._12_4_;
      strm.next_in = (uint8_t *)(long)(int)(uint)mem._vptr_MEMORY;
      strm.total_in = mem2_1._8_8_;
      strm.next_out = (uint8_t *)(long)(int)mem2_1._vptr_MEMORY;
      local_be0[0] = lzma_code(&ret,3);
      if (local_be0[0] == LZMA_STREAM_END) {
        _iStack_70 = (long)(int)mem2_1._vptr_MEMORY - (long)strm.next_out;
        memcpy((void *)mem._8_8_,(void *)mem2_1._8_8_,_iStack_70);
        this->m_compress = Xz;
        local_be0[0] = LZMA_OK;
      }
    }
    if (local_be0[0] != LZMA_OK) {
      peVar8 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[26],lzma_ret&,char_const(&)[2]>
                (peVar8,(char (*) [26])"xz decompression failed (",local_be0,(char (*) [2])0x2a8e34)
      ;
      __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
    }
    MEMORY::~MEMORY((MEMORY *)&strm.reserved_enum1);
  }
  if (0x10000000 < _iStack_70) {
    peVar8 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[18]>(peVar8,(char (*) [18])"file size too big");
    __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
  }
  iVar1 = open(this,(char *)mem._8_8_,iStack_70,__file,&mem.pb);
  MEMORY::~MEMORY((MEMORY *)local_58);
  uVar11 = std::__cxx11::string::~string((string *)&mem.pb);
  return (uint)CONCAT71((int7)((ulong)uVar11 >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool MemFile::open(const std::string& path_, bool uncompress)
{
    std::string filename;
    MEMORY mem(MAX_IMAGE_SIZE + 1);
    size_t uRead = 0;

    // Check if zlib is available
#ifndef HAVE_ZLIB
    bool have_zlib = false;
#else
    bool have_zlib = zlibVersion()[0] == ZLIB_VERSION[0];

    // Read start of file to check for compression signatures.
    if (uncompress && have_zlib)
    {
        FILE* f = fopen(path_.c_str(), "rb");
        if (!f)
            throw posix_error(errno, path_.c_str());

        if (!fread(mem, 1, 2, f))
            mem[0] = mem[1] = '\0';

        fclose(f);
    }

    if (uncompress && have_zlib)
    {
        // Require zip file header magic.
        if (mem[0U] == 'P' && mem[1U] == 'K')
        {
            unzFile hfZip = unzOpen(path_.c_str());
            if (!hfZip)
                throw util::exception("bad zip file");

            int nRet;
            unz_file_info sInfo;
            uLong ulMaxSize = 0;

            // Iterate through the contents of the zip looking for a file with a suitable size
            for (nRet = unzGoToFirstFile(hfZip); nRet == UNZ_OK; nRet = unzGoToNextFile(hfZip))
            {
                char szFile[MAX_PATH];

                // Get details of the current file
                unzGetCurrentFileInfo(hfZip, &sInfo, szFile, MAX_PATH, nullptr, 0, nullptr, 0);

                // Ignore directories and empty files
                if (!sInfo.uncompressed_size)
                    continue;

                // If the file extension is recognised, read the file contents
                // ToDo: GetFileType doesn't really belong here?
                if (GetFileType(szFile) != ftUnknown && unzOpenCurrentFile(hfZip) == UNZ_OK)
                {
                    nRet = unzReadCurrentFile(hfZip, mem, static_cast<unsigned int>(mem.size));
                    unzCloseCurrentFile(hfZip);
                    filename = szFile;
                    break;
                }

                // Rememeber the largest uncompressed file size
                if (sInfo.uncompressed_size > ulMaxSize)
                    ulMaxSize = sInfo.uncompressed_size;
            }

            // Did we fail to find a matching extension?
            if (nRet == UNZ_END_OF_LIST_OF_FILE)
            {
                // Loop back over the archive
                for (nRet = unzGoToFirstFile(hfZip); nRet == UNZ_OK; nRet = unzGoToNextFile(hfZip))
                {
                    // Get details of the current file
                    unzGetCurrentFileInfo(hfZip, &sInfo, nullptr, 0, nullptr, 0, nullptr, 0);

                    // Open the largest file found about
                    if (sInfo.uncompressed_size == ulMaxSize && unzOpenCurrentFile(hfZip) == UNZ_OK)
                    {
                        nRet = unzReadCurrentFile(hfZip, mem, static_cast<unsigned int>(mem.size));
                        unzCloseCurrentFile(hfZip);
                        break;
                    }
                }
            }

            // Close the zip archive
            unzClose(hfZip);

            if (nRet < 0)
                throw util::exception("zip extraction failed (", nRet, ")");

            uRead = nRet;
            m_compress = Compress::Zip;
        }
        // Require gzip file header magic.
        else if (mem[0U] == 0x1f && mem[1U] == 0x8b)
        {
            // Open as gzipped or uncompressed
            gzFile gf = gzopen(path_.c_str(), "rb");
            if (gf == Z_NULL)
                throw posix_error(errno, path_.c_str());

            uRead = gzread(gf, mem, static_cast<unsigned>(mem.size));
            m_compress = gzdirect(gf) ? Compress::None : Compress::Gzip;
            gzclose(gf);

            // If gzipped, attempt to extract the original filename
            if (m_compress == Compress::Gzip)
            {
                std::ifstream zs(path_.c_str(), std::ios_base::binary);
                std::vector<uint8_t> zbuf((std::istreambuf_iterator<char>(zs)),
                    std::istreambuf_iterator<char>());

                z_stream stream{};
                stream.next_in = zbuf.data();
                stream.avail_in = static_cast<uInt>(zbuf.size());
                stream.next_out = zbuf.data();  // same as next_in!
                stream.avail_out = 0;           // we don't want data

                auto zerr = inflateInit2(&stream, 16 + MAX_WBITS); // 16=gzip
                if (zerr == Z_OK)
                {
                    Bytef name[MAX_PATH]{};
                    gz_header header{};
                    header.name = name;
                    header.name_max = MAX_PATH;

                    zerr = inflateGetHeader(&stream, &header);
                    zerr = inflate(&stream, 0);
                    if (zerr == Z_OK && name[0])
                        filename = reinterpret_cast<const char*>(name);
                    inflateEnd(&stream);
                }
            }
        }
    }
#endif // HAVE_ZLIB

    // If didn't read as a compressed file, open as normal file.
    if (!uRead)
    {
        FILE* f = fopen(path_.c_str(), "rb");
        if (!f)
            throw posix_error(errno, path_.c_str());

        uRead = fread(mem, 1, mem.size, f);
        fclose(f);
        m_compress = Compress::None;
    }

    // zip compressed? (and not handled above)
    if (uncompress && mem[0U] == 'P' && mem[1U] == 'K')
        throw util::exception("zlib support is not available for zipped files");
    // gzip compressed?
    if (uncompress && mem[0U] == 0x1f && mem[1U] == 0x8b)
    {
        if (!have_zlib)
            throw util::exception("zlib support is not available for gzipped files");

        // Unknowingly gzipped image files may be zipped, so we need to handle
        // a second level of decompression here.
#ifdef HAVE_ZLIB
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        z_stream stream{};
        stream.next_in = mem.pb;
        stream.avail_in = static_cast<uInt>(uRead);
        stream.next_out = mem2.pb;
        stream.avail_out = static_cast<uInt>(mem2.size);

        auto zerr = inflateInit2(&stream, 16 + MAX_WBITS);
        if (zerr == Z_OK)
        {
            Bytef name[MAX_PATH]{};
            gz_header header{};
            header.name = name;
            header.name_max = MAX_PATH;

            zerr = inflateGetHeader(&stream, &header);
            zerr = inflate(&stream, Z_FINISH);
            if (zerr == Z_STREAM_END && name[0])
                filename = reinterpret_cast<const char*>(name);
            inflateEnd(&stream);
        }

        if (zerr != Z_STREAM_END)
            throw util::exception("gzip decompression failed (", zerr, ")");

        memcpy(mem.pb, mem2.pb, uRead = stream.total_out);
        m_compress = Compress::Zip;
#endif
    }

    // bzip2 compressed?
    if (uncompress && mem[0U] == 'B' && mem[1U] == 'Z')
    {
#ifndef HAVE_BZIP2
        throw util::exception("bzip2 support is not available");
#else
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        auto uBzRead = static_cast<unsigned>(mem2.size);
        auto bzerr = BZ2_bzBuffToBuffDecompress(
            reinterpret_cast<char*>(mem2.pb), &uBzRead,
            reinterpret_cast<char*>(mem.pb), static_cast<int>(uRead), 0, 0);
        if (bzerr != BZ_OK)
            throw util::exception("bzip2 decompression failed (", bzerr, ")");

        memcpy(mem.pb, mem2.pb, uRead = uBzRead);
        m_compress = Compress::Bzip2;
#endif // HAVE_BZIP2
    }

    if (uncompress && mem.size > 6 && !memcmp(mem.pb, "\xfd\x37\x7a\x58\x5a\x00", 6))
    {
#ifndef HAVE_LZMA
        throw util::exception("lzma support is not available");
#else
        MEMORY mem2(MAX_IMAGE_SIZE + 1);

        lzma_stream strm{};
        const uint32_t flags = LZMA_TELL_UNSUPPORTED_CHECK;
        auto ret = lzma_stream_decoder(&strm, UINT64_MAX, flags);
        if (ret == LZMA_OK)
        {
            strm.next_in = mem.pb;
            strm.avail_in = mem.size;
            strm.next_out = mem2.pb;
            strm.avail_out = mem2.size;

            ret = lzma_code(&strm, LZMA_FINISH);
            if (ret == LZMA_STREAM_END)
            {
                uRead = mem2.size - strm.avail_out;
                memcpy(mem.pb, mem2.pb, uRead);
                m_compress = Compress::Xz;
                ret = LZMA_OK;
            }
        }

        if (ret != LZMA_OK)
            throw util::exception("xz decompression failed (", ret, ")");
#endif
    }

    if (uRead <= MAX_IMAGE_SIZE)
        return open(mem.pb, static_cast<int>(uRead), path_, filename);

    throw util::exception("file size too big");
}